

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O0

ssize_t __thiscall
gvr::anon_unknown_3::PLYValueBigInt16::write(PLYValueBigInt16 *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  
  std::streambuf::sputc((char)__fd);
  sVar1 = std::streambuf::sputc((char)__fd);
  return sVar1;
}

Assistant:

void write(std::streambuf *out, int v)
    {
      out->sputc(static_cast<char>((v>>8)&0xff));
      out->sputc(static_cast<char>(v&0xff));
    }